

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata_varnode.cc
# Opt level: O0

void __thiscall Funcdata::totalReplaceConstant(Funcdata *this,Varnode *vn,uintb val)

{
  Varnode *pVVar1;
  bool bVar2;
  int4 iVar3;
  reference ppPVar4;
  PcodeOp *pPVar5;
  Address *pc;
  BlockGraph *this_00;
  Varnode *pVVar6;
  Address local_78;
  BlockBasic *local_68;
  BlockBasic *bb;
  _Self local_58;
  _List_node_base *local_50;
  int4 local_44;
  Varnode *pVStack_40;
  int4 i;
  Varnode *newrep;
  PcodeOp *copyop;
  PcodeOp *op;
  const_iterator iter;
  uintb val_local;
  Varnode *vn_local;
  Funcdata *this_local;
  
  iter._M_node = (_List_node_base *)val;
  std::_List_const_iterator<PcodeOp_*>::_List_const_iterator((_List_const_iterator<PcodeOp_*> *)&op)
  ;
  newrep = (Varnode *)0x0;
  local_50 = (_List_node_base *)Varnode::beginDescend(vn);
  op = (PcodeOp *)local_50;
  while( true ) {
    local_58._M_node = (_List_node_base *)Varnode::endDescend(vn);
    bVar2 = std::operator!=((_Self *)&op,&local_58);
    if (!bVar2) break;
    bb = (BlockBasic *)
         std::_List_const_iterator<PcodeOp_*>::operator++((_List_const_iterator<PcodeOp_*> *)&op,0);
    ppPVar4 = std::_List_const_iterator<PcodeOp_*>::operator*
                        ((_List_const_iterator<PcodeOp_*> *)&bb);
    copyop = *ppPVar4;
    local_44 = PcodeOp::getSlot(copyop,vn);
    bVar2 = PcodeOp::isMarker(copyop);
    if (bVar2) {
      if (newrep == (Varnode *)0x0) {
        bVar2 = Varnode::isWritten(vn);
        if (bVar2) {
          pPVar5 = Varnode::getDef(vn);
          pc = PcodeOp::getAddr(pPVar5);
          newrep = (Varnode *)newOp(this,1,pc);
          opSetOpcode(this,(PcodeOp *)newrep,CPUI_COPY);
          iVar3 = Varnode::getSize(vn);
          pVStack_40 = newUniqueOut(this,iVar3,(PcodeOp *)newrep);
          pVVar1 = newrep;
          iVar3 = Varnode::getSize(vn);
          pVVar6 = newConstant(this,iVar3,(uintb)iter._M_node);
          opSetInput(this,(PcodeOp *)pVVar1,pVVar6,0);
          pVVar1 = newrep;
          pPVar5 = Varnode::getDef(vn);
          opInsertAfter(this,(PcodeOp *)pVVar1,pPVar5);
        }
        else {
          this_00 = getBasicBlocks(this);
          local_68 = (BlockBasic *)BlockGraph::getBlock(this_00,0);
          (*(local_68->super_FlowBlock)._vptr_FlowBlock[2])(&local_78);
          newrep = (Varnode *)newOp(this,1,&local_78);
          opSetOpcode(this,(PcodeOp *)newrep,CPUI_COPY);
          iVar3 = Varnode::getSize(vn);
          pVStack_40 = newUniqueOut(this,iVar3,(PcodeOp *)newrep);
          pVVar1 = newrep;
          iVar3 = Varnode::getSize(vn);
          pVVar6 = newConstant(this,iVar3,(uintb)iter._M_node);
          opSetInput(this,(PcodeOp *)pVVar1,pVVar6,0);
          opInsertBegin(this,(PcodeOp *)newrep,local_68);
        }
      }
      else {
        pVStack_40 = PcodeOp::getOut((PcodeOp *)newrep);
      }
    }
    else {
      iVar3 = Varnode::getSize(vn);
      pVStack_40 = newConstant(this,iVar3,(uintb)iter._M_node);
    }
    opSetInput(this,copyop,pVStack_40,local_44);
  }
  return;
}

Assistant:

void Funcdata::totalReplaceConstant(Varnode *vn,uintb val)

{
  list<PcodeOp *>::const_iterator iter;
  PcodeOp *op;
  PcodeOp *copyop = (PcodeOp *)0;
  Varnode *newrep;
  int4 i;

  iter = vn->beginDescend();
  while(iter != vn->endDescend()) {
    op = *iter++;		// Increment before removing descendant
    i = op->getSlot(vn);
    if (op->isMarker()) {    // Do not put constant directly in marker
      if (copyop == (PcodeOp *)0) {
	if (vn->isWritten()) {
	  copyop = newOp(1,vn->getDef()->getAddr());
	  opSetOpcode(copyop,CPUI_COPY);
	  newrep = newUniqueOut(vn->getSize(),copyop);
	  opSetInput(copyop,newConstant(vn->getSize(),val),0);
	  opInsertAfter(copyop,vn->getDef());
	}
	else {
	  BlockBasic *bb = (BlockBasic *)getBasicBlocks().getBlock(0);
	  copyop = newOp(1,bb->getStart());
	  opSetOpcode(copyop,CPUI_COPY);
	  newrep = newUniqueOut(vn->getSize(),copyop);
	  opSetInput(copyop,newConstant(vn->getSize(),val),0);
	  opInsertBegin(copyop,bb);
	}
      }
      else
	newrep = copyop->getOut();
    }
    else
      newrep = newConstant(vn->getSize(),val);
    opSetInput(op,newrep,i);
  }
}